

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prelude.cpp
# Opt level: O1

variables_map * parse_cmdargs(int argc,char **argv)

{
  char *pcVar1;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar2;
  const_iterator cVar3;
  ostream *poVar4;
  char **in_RDX;
  undefined4 in_register_0000003c;
  variables_map *this;
  options_description desc;
  undefined1 local_f0 [16];
  undefined1 local_e0 [24];
  long *local_c8;
  long local_b8 [3];
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  local_a0 [24];
  void *local_88;
  undefined4 local_80;
  undefined8 local_78;
  undefined4 local_70;
  long local_68;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_60 [24];
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_48;
  
  this = (variables_map *)CONCAT44(in_register_0000003c,argc);
  boost::program_options::variables_map::variables_map(this);
  local_f0._0_8_ = (pointer)local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"Allowed options","");
  boost::program_options::options_description::options_description
            ((options_description *)&local_c8,(string *)local_f0,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  if ((pointer)local_f0._0_8_ != (pointer)local_e0) {
    operator_delete((void *)local_f0._0_8_,(ulong)(local_e0._0_8_ + 1));
  }
  local_f0._0_8_ = boost::program_options::options_description::add_options();
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (local_f0,"help,h");
  pcVar1 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar1,"text,t");
  ptVar2 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  ptVar2->m_required = true;
  boost::program_options::options_description_easy_init::operator()
            (pcVar1,(value_semantic *)"input,i",(char *)ptVar2);
  local_48.super_function_base.vtable = (vtable_base *)0x0;
  local_48.super_function_base.functor.members.obj_ptr = (obj_ptr_t)0x0;
  local_48.super_function_base.functor._8_8_ = 0;
  local_48.super_function_base.functor._16_8_ = 0;
  boost::program_options::parse_command_line<char>
            ((basic_parsed_options<char> *)local_f0,(int)argv,in_RDX,
             (options_description *)&local_c8,0,&local_48);
  boost::program_options::store((basic_parsed_options *)local_f0,this,false);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             *)local_f0);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1(&local_48);
  local_f0._0_8_ = (pointer)local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"help","");
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                  *)(this + 0x10),(key_type *)local_f0);
  if ((pointer)local_f0._0_8_ != (pointer)local_e0) {
    operator_delete((void *)local_f0._0_8_,(ulong)(local_e0._0_8_ + 1));
  }
  if (cVar3._M_node == (_Base_ptr)(this + 0x18)) {
    boost::program_options::notify(this);
    std::
    vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
    ::~vector(local_60);
    if (local_88 != (void *)0x0) {
      operator_delete(local_88,local_68 - (long)local_88);
      local_88 = (void *)0x0;
      local_80 = 0;
      local_78 = 0;
      local_70 = 0;
      local_68 = 0;
    }
    std::
    vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
    ::~vector(local_a0);
    if (local_c8 != local_b8) {
      operator_delete(local_c8,local_b8[0] + 1);
    }
    return this;
  }
  poVar4 = (ostream *)
           boost::program_options::operator<<
                     ((ostream *)&std::cout,(options_description *)&local_c8);
  std::operator<<(poVar4,"\n");
  exit(0);
}

Assistant:

po::variables_map parse_cmdargs(int argc, char const* argv[])
{
    po::variables_map vm;
    po::options_description desc("Allowed options");
    // clang-format off
    desc.add_options()
        ("help,h", "produce help message")
        ("text,t", "text input (default is uint32_t binary)")
        ("input,i",po::value<std::string>()->required(), "the input dir");
    // clang-format on
    try {
        po::store(po::parse_command_line(argc, argv, desc), vm);
        if (vm.count("help")) {
            std::cout << desc << "\n";
            exit(EXIT_SUCCESS);
        }
        po::notify(vm);
    } catch (const po::required_option& e) {
        std::cout << desc;
        std::cerr << "Missing required option: " << e.what() << std::endl;
        exit(EXIT_FAILURE);
    } catch (po::error& e) {
        std::cout << desc;
        std::cerr << "Error parsing cmdargs: " << e.what() << std::endl;
        exit(EXIT_FAILURE);
    }

    return vm;
}